

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::Write(DBImpl *this,WriteOptions *options,WriteBatch *updates)

{
  Slice *slice;
  value_type this_00;
  Slice SVar1;
  int iVar2;
  reference ppWVar3;
  Mutex *in_RCX;
  bool bVar4;
  Writer *ready;
  Status local_e0;
  byte local_d1;
  undefined1 auStack_d0 [7];
  bool sync_error;
  size_t local_c8;
  undefined1 local_c0 [16];
  WriteBatch *updates_1;
  Writer *last_writer;
  uint64_t last_sequence;
  value_type local_98 [3];
  MutexLock local_80;
  MutexLock l;
  Writer w;
  WriteBatch *updates_local;
  WriteOptions *options_local;
  DBImpl *this_local;
  Status *status;
  
  w.cv.mu_ = in_RCX;
  Writer::Writer((Writer *)&l,(Mutex *)(options + 200));
  w.status.state_ = (char *)w.cv.mu_;
  w.batch._0_1_ = (byte)updates->rep_ & 1;
  w.batch._1_1_ = 0;
  MutexLock::MutexLock(&local_80,(Mutex *)(options + 200));
  local_98[0] = (value_type)&l;
  std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::push_back
            ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
             (options + 0x168),local_98);
  while( true ) {
    bVar4 = false;
    if ((w.batch._1_1_ & 1) == 0) {
      ppWVar3 = std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::
                front((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
                       *)(options + 0x168));
      bVar4 = (value_type)&l != *ppWVar3;
    }
    if (!bVar4) break;
    port::CondVar::Wait((CondVar *)&w.sync);
  }
  if ((w.batch._1_1_ & 1) == 0) {
    last_sequence._3_1_ = 0;
    MakeRoomForWrite(this,SUB81(options,0));
    last_writer = (Writer *)VersionSet::LastSequence(*(VersionSet **)(options + 0x228));
    updates_1 = (WriteBatch *)&l;
    bVar4 = Status::ok((Status *)this);
    SVar1.size_ = local_c8;
    SVar1.data_ = _auStack_d0;
    if ((bVar4) && (_auStack_d0 = SVar1, w.cv.mu_ != (Mutex *)0x0)) {
      local_c0._8_8_ = BuildBatchGroup((DBImpl *)options,(Writer **)&updates_1);
      WriteBatchInternal::SetSequence
                ((WriteBatch *)local_c0._8_8_,
                 (SequenceNumber)((long)&(last_writer->status).state_ + 1));
      iVar2 = WriteBatchInternal::Count((WriteBatch *)local_c0._8_8_);
      last_writer = (Writer *)((long)&(last_writer->status).state_ + (long)iVar2);
      port::Mutex::Unlock((Mutex *)(options + 200));
      slice = *(Slice **)(options + 0x158);
      _auStack_d0 = WriteBatchInternal::Contents((WriteBatch *)local_c0._8_8_);
      log::Writer::AddRecord((Writer *)local_c0,slice);
      Status::operator=((Status *)this,(Status *)local_c0);
      Status::~Status((Status *)local_c0);
      local_d1 = 0;
      bVar4 = Status::ok((Status *)this);
      if ((bVar4) && (((byte)updates->rep_ & 1) != 0)) {
        (**(code **)(**(long **)(options + 0x148) + 0x28))(&local_e0);
        Status::operator=((Status *)this,&local_e0);
        Status::~Status(&local_e0);
        bVar4 = Status::ok((Status *)this);
        if (!bVar4) {
          local_d1 = 1;
        }
      }
      bVar4 = Status::ok((Status *)this);
      if (bVar4) {
        WriteBatchInternal::InsertInto
                  ((WriteBatchInternal *)&ready,(WriteBatch *)local_c0._8_8_,
                   *(MemTable **)(options + 0x130));
        Status::operator=((Status *)this,(Status *)&ready);
        Status::~Status((Status *)&ready);
      }
      port::Mutex::Lock((Mutex *)(options + 200));
      if ((local_d1 & 1) != 0) {
        RecordBackgroundError((DBImpl *)options,(Status *)this);
      }
      if ((WriteBatch *)local_c0._8_8_ == *(WriteBatch **)(options + 0x1b8)) {
        WriteBatch::Clear(*(WriteBatch **)(options + 0x1b8));
      }
      VersionSet::SetLastSequence(*(VersionSet **)(options + 0x228),(uint64_t)last_writer);
    }
    do {
      ppWVar3 = std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::
                front((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
                       *)(options + 0x168));
      this_00 = *ppWVar3;
      std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::pop_front
                ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
                 (options + 0x168));
      if (this_00 != (value_type)&l) {
        Status::operator=(&this_00->status,(Status *)this);
        this_00->done = true;
        port::CondVar::Signal(&this_00->cv);
      }
    } while (this_00 != (value_type)updates_1);
    bVar4 = std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::empty
                      ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
                        *)(options + 0x168));
    if (!bVar4) {
      ppWVar3 = std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::
                front((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
                       *)(options + 0x168));
      port::CondVar::Signal(&(*ppWVar3)->cv);
    }
    last_sequence._3_1_ = 1;
  }
  else {
    Status::Status((Status *)this,(Status *)&l);
  }
  last_sequence._4_4_ = 1;
  MutexLock::~MutexLock(&local_80);
  Writer::~Writer((Writer *)&l);
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::Write(const WriteOptions& options, WriteBatch* updates) {
  Writer w(&mutex_);
  w.batch = updates;
  w.sync = options.sync;
  w.done = false;

  MutexLock l(&mutex_);
  writers_.push_back(&w);
  while (!w.done && &w != writers_.front()) {
    w.cv.Wait();
  }
  if (w.done) {
    return w.status;
  }

  // May temporarily unlock and wait.
  Status status = MakeRoomForWrite(updates == nullptr);
  uint64_t last_sequence = versions_->LastSequence();
  Writer* last_writer = &w;
  if (status.ok() && updates != nullptr) {  // nullptr batch is for compactions
    WriteBatch* updates = BuildBatchGroup(&last_writer);
    WriteBatchInternal::SetSequence(updates, last_sequence + 1);
    last_sequence += WriteBatchInternal::Count(updates);

    // Add to log and apply to memtable.  We can release the lock
    // during this phase since &w is currently responsible for logging
    // and protects against concurrent loggers and concurrent writes
    // into mem_.
    {
      mutex_.Unlock();
      status = log_->AddRecord(WriteBatchInternal::Contents(updates));
      bool sync_error = false;
      if (status.ok() && options.sync) {
        status = logfile_->Sync();
        if (!status.ok()) {
          sync_error = true;
        }
      }
      if (status.ok()) {
        status = WriteBatchInternal::InsertInto(updates, mem_);
      }
      mutex_.Lock();
      if (sync_error) {
        // The state of the log file is indeterminate: the log record we
        // just added may or may not show up when the DB is re-opened.
        // So we force the DB into a mode where all future writes fail.
        RecordBackgroundError(status);
      }
    }
    if (updates == tmp_batch_) tmp_batch_->Clear();

    versions_->SetLastSequence(last_sequence);
  }

  while (true) {
    Writer* ready = writers_.front();
    writers_.pop_front();
    if (ready != &w) {
      ready->status = status;
      ready->done = true;
      ready->cv.Signal();
    }
    if (ready == last_writer) break;
  }

  // Notify new head of write queue
  if (!writers_.empty()) {
    writers_.front()->cv.Signal();
  }

  return status;
}